

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O1

unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
 __thiscall
JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::operator->
          (JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1> *this)

{
  char cVar1;
  WrappedInt<HalfCycles> cycles;
  _Head_base<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)1>_*,_false> in_RDX;
  TMS9918<(TI::TMS::Personality)1> *extraout_RDX;
  _func_int **in_RSI;
  unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  uVar2;
  
  LOCK();
  cVar1 = *(char *)(in_RSI + 0xa762);
  *(char *)(in_RSI + 0xa762) = '\x01';
  UNLOCK();
  if (cVar1 == '\0') {
    if (*(char *)(in_RSI + 0xa761) == '\0') {
      *(undefined2 *)(in_RSI + 0xa761) = 0x101;
      cycles.length_ = ((WrappedInt<HalfCycles> *)(in_RSI + 0xa75e))->length_;
      in_RSI[0xa75e] = (_func_int *)0x0;
      TI::TMS::TMS9918<(TI::TMS::Personality)1>::run_for
                ((TMS9918<(TI::TMS::Personality)1> *)(in_RSI + 1),(HalfCycles)cycles.length_);
      in_RDX._M_head_impl = extraout_RDX;
    }
    LOCK();
    *(undefined1 *)(in_RSI + 0xa762) = 0;
    UNLOCK();
    (this->super_Observer)._vptr_Observer = in_RSI;
    (this->object_).super_Base<(TI::TMS::Personality)1>.super_Storage<(TI::TMS::Personality)1,_void>
    .super_YamahaFetcher.next_event_ = (Event *)(in_RSI + 1);
    uVar2._M_t.
    super___uniq_ptr_impl<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)1>_*,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .super__Head_base<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)1>_*,_false>._M_head_impl =
         in_RDX._M_head_impl;
    uVar2._M_t.
    super___uniq_ptr_impl<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)1>_*,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Tuple_impl<1UL,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Head_base<1UL,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
    ._M_head_impl.actor_ =
         (_Head_base<1UL,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
          )(_Head_base<1UL,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
            )this;
    return (unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
            )uVar2._M_t.
             super___uniq_ptr_impl<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
             ._M_t.
             super__Tuple_impl<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)1>_*,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)1>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ;
  }
  __assert_fail("!flush_concurrency_check_.test_and_set()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/MSX/../../ClockReceiver/JustInTime.hpp"
                ,0x7e,
                "auto JustInTimeActor<TI::TMS::TMS9918<TI::TMS::V9938>>::operator->() [T = TI::TMS::TMS9918<TI::TMS::V9938>, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
               );
}

Assistant:

[[nodiscard]] forceinline auto operator->() {
#ifndef NDEBUG
			assert(!flush_concurrency_check_.test_and_set());
#endif
			flush();
#ifndef NDEBUG
			flush_concurrency_check_.clear();
#endif
			return std::unique_ptr<T, SequencePointAwareDeleter>(&object_, SequencePointAwareDeleter(this));
		}